

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

stbi_uc * stbi_load_from_file(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  uchar *puVar1;
  FILE *in_RDI;
  stbi__context s;
  uchar *result;
  FILE *in_stack_fffffffffffffef8;
  stbi__context *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff3c;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  stbi__context *in_stack_ffffffffffffff58;
  undefined4 local_50;
  undefined4 local_48;
  
  stbi__start_file(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  puVar1 = stbi__load_and_postprocess_8bit
                     (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if (puVar1 != (uchar *)0x0) {
    fseek(in_RDI,(long)-(local_48 - local_50),1);
  }
  return puVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_file(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}